

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx::forward_fp16s
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Mat *in_RCX;
  Mat *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar1;
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  int in_stack_fffffffffffffe14;
  Mat *in_stack_fffffffffffffe18;
  void **ppvVar2;
  uint7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  Mat *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  void *local_158;
  size_t sStack_150;
  size_t sStack_148;
  undefined8 uStack_140;
  Allocator *local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  void *local_118;
  int *local_110;
  long *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  int local_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_c0;
  int local_bc;
  Mat *local_b8;
  Mat *local_b0;
  int local_94;
  void **local_90;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  Mat *local_60;
  void **local_58;
  Mat *local_50;
  void **local_40;
  void *local_38;
  Mat *local_28;
  void **local_20;
  Mat *local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_bc = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  local_b8 = in_RCX;
  local_b0 = in_RDX;
  if (((int)in_RSI[5] == 2) && (*(int *)((long)in_RSI + 0x2c) == local_bc)) {
    local_c0 = (undefined4)in_RSI[6];
    local_c8 = in_RSI[2];
    local_cc = (undefined4)in_RSI[3];
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                (Allocator *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    local_50 = local_b0;
    bVar1 = true;
    if (local_b0->data != (void *)0x0) {
      local_28 = local_b0;
      bVar1 = local_b0->cstep * (long)local_b0->c == 0;
    }
    if (!bVar1) {
      innerproduct_gemm_fp16s_sse
                ((Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28,
                 (Mat *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,local_b8,
                 (Option *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      return 0;
    }
    return -100;
  }
  local_40 = &local_118;
  local_118 = (void *)*in_RSI;
  local_110 = (int *)in_RSI[1];
  local_f8 = (long *)in_RSI[4];
  local_f0 = (undefined4)in_RSI[5];
  local_ec = *(undefined4 *)((long)in_RSI + 0x2c);
  local_e8 = (undefined4)in_RSI[6];
  local_e4 = *(undefined4 *)((long)in_RSI + 0x34);
  local_e0 = (int)in_RSI[7];
  local_d8 = in_RSI[8];
  if (local_110 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_110;
    *local_110 = *local_110 + 1;
    UNLOCK();
  }
  local_8 = local_40;
  if ((int)in_RSI[5] != 1) {
    local_158 = in_RCX->data;
    sStack_148 = in_RCX->elemsize;
    uStack_140 = *(undefined8 *)&in_RCX->elempack;
    local_138 = in_RCX->allocator;
    uStack_130._0_4_ = in_RCX->dims;
    uStack_130._4_4_ = in_RCX->w;
    uStack_128._0_4_ = in_RCX->h;
    uStack_128._4_4_ = in_RCX->d;
    uStack_120 = *(undefined8 *)&in_RCX->c;
    sStack_150 = in_RCX->elemsize;
    (**(code **)(**(long **)(in_RDI + 0x250) + 0x38))
              (*(long **)(in_RDI + 0x250),in_RSI,&local_118,&local_158);
    local_58 = &local_118;
    if (local_118 != (void *)0x0) {
      local_20 = local_58;
    }
    if (local_118 == (void *)0x0 || local_d8 * local_e0 == 0) {
      local_94 = -100;
      goto LAB_00e102e6;
    }
    in_stack_fffffffffffffe47 = 0;
  }
  if (((ulong)local_b8->allocator & 0x100000000000000) != 0) {
    if (*(int *)(in_RDI + 0xd0) % 8 == 0) {
      in_stack_fffffffffffffe34 = 8;
    }
    else {
      in_stack_fffffffffffffe34 = 1;
      if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
        in_stack_fffffffffffffe34 = 4;
      }
    }
  }
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
              in_stack_fffffffffffffe3c,
              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              (Allocator *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  local_60 = local_b0;
  uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffe30);
  if (local_b0->data != (void *)0x0) {
    local_18 = local_b0;
    uVar3 = CONCAT13(local_b0->cstep * (long)local_b0->c == 0,(int3)in_stack_fffffffffffffe30);
  }
  if ((char)((uint)uVar3 >> 0x18) == '\0') {
    innerproduct_fp16s_sse
              ((Mat *)CONCAT44(in_stack_fffffffffffffe34,uVar3),local_b0,
               (Mat *)(ulong)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe14,local_b8,
               (Option *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    local_94 = 0;
  }
  else {
    local_94 = -100;
  }
LAB_00e102e6:
  ppvVar2 = &local_118;
  if (local_110 != (int *)0x0) {
    local_6c = 0xffffffff;
    LOCK();
    local_70 = *local_110;
    *local_110 = *local_110 + -1;
    UNLOCK();
    if (local_70 == 1) {
      local_90 = ppvVar2;
      local_68 = ppvVar2;
      if (local_f8 == (long *)0x0) {
        local_38 = local_118;
        if (local_118 != (void *)0x0) {
          free(local_118);
        }
      }
      else {
        (**(code **)(*local_f8 + 0x18))(local_f8,local_118);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_94;
}

Assistant:

int InnerProduct_x86_avx::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}